

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2r2rect.cc
# Opt level: O1

S2R2Rect * S2R2Rect::FromCellId(S2CellId id)

{
  S2R2Rect *in_RDI;
  double dVar1;
  S2CellId local_38;
  R2Point local_30;
  R2Point local_20;
  
  dVar1 = S2CellId::GetSizeST(&local_38);
  local_20 = S2CellId::GetCenterST(&local_38);
  local_30.c_[0] = dVar1;
  local_30.c_[1] = dVar1;
  R2Rect::FromCenterSize(&in_RDI->rect_,&local_20,&local_30);
  (in_RDI->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002c2ef8;
  return in_RDI;
}

Assistant:

S2R2Rect S2R2Rect::FromCellId(S2CellId id) {
  double size = id.GetSizeST();
  return FromCenterSize(id.GetCenterST(), R2Point(size, size));
}